

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O0

void __thiscall
draco::AttributeQuantizationTransform::GeneratePortableAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute,int num_points,
          PointAttribute *target_attribute)

{
  undefined1 auVar1 [16];
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  vector<float,_std::allocator<float>_> *this_00;
  uint in_EDX;
  GeometryAttribute *in_RSI;
  AttributeQuantizationTransform *in_RDI;
  float range;
  int32_t q_val;
  float value;
  int c;
  AttributeValueIndex att_val_id;
  PointIndex i;
  unique_ptr<float[],_std::default_delete<float[]>_> att_val;
  int32_t dst_index;
  Quantizer quantizer;
  uint32_t max_quantized_value;
  int32_t *portable_attribute_data;
  int num_components;
  undefined4 in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  PointIndex in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  GeometryAttribute *in_stack_ffffffffffffff48;
  type in_stack_ffffffffffffff50;
  GeometryAttribute *this_01;
  AttributeValueIndex in_stack_ffffffffffffff64;
  int local_70;
  uint local_60 [5];
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_4c [3];
  int local_40;
  Quantizer local_3c;
  int local_38;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_34;
  uint8_t *local_30;
  uint local_24;
  uint local_14;
  GeometryAttribute *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  bVar2 = GeometryAttribute::num_components(in_RSI);
  local_24 = (uint)bVar2;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_34,0);
  local_30 = GeometryAttribute::GetAddress
                       (in_stack_ffffffffffffff48,
                        (AttributeValueIndex)(uint)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  local_38 = (1 << ((byte)in_RDI->quantization_bits_ & 0x1f)) + -1;
  Quantizer::Quantizer(&local_3c);
  range = AttributeQuantizationTransform::range(in_RDI);
  Quantizer::Init(&local_3c,range,local_38);
  local_40 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)local_24;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  operator_new__(uVar4);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40.value_),
             (float *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(local_4c,0);
  while( true ) {
    local_60[0] = local_14;
    bVar3 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<(local_4c,local_60);
    in_stack_ffffffffffffff64.value_ = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff64.value_);
    if (!bVar3) break;
    PointAttribute::mapped_index
              ((PointAttribute *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff40);
    this_01 = local_10;
    std::unique_ptr<float[],_std::default_delete<float[]>_>::get
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40.value_));
    GeometryAttribute::GetValue(this_01,in_stack_ffffffffffffff64,in_stack_ffffffffffffff50);
    for (local_70 = 0; local_70 < (int)local_24; local_70 = local_70 + 1) {
      in_stack_ffffffffffffff50 =
           std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40.value_),
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      in_stack_ffffffffffffff44 = *in_stack_ffffffffffffff50;
      this_00 = min_values(in_RDI);
      std::vector<float,_std::allocator<float>_>::operator[](this_00,(long)local_70);
      in_stack_ffffffffffffff40.value_ =
           Quantizer::QuantizeFloat
                     ((Quantizer *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40.value_),
                      in_stack_ffffffffffffff3c);
      *(uint *)(local_30 + (long)local_40 * 4) = in_stack_ffffffffffffff40.value_;
      local_40 = local_40 + 1;
    }
    IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(local_4c);
  }
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40.value_));
  return;
}

Assistant:

void AttributeQuantizationTransform::GeneratePortableAttribute(
    const PointAttribute &attribute, int num_points,
    PointAttribute *target_attribute) const {
  DRACO_DCHECK(is_initialized());

  const int num_components = attribute.num_components();

  // Quantize all values using the order given by point_ids.
  int32_t *const portable_attribute_data = reinterpret_cast<int32_t *>(
      target_attribute->GetAddress(AttributeValueIndex(0)));
  const uint32_t max_quantized_value = (1 << (quantization_bits_)) - 1;
  Quantizer quantizer;
  quantizer.Init(range(), max_quantized_value);
  int32_t dst_index = 0;
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  for (PointIndex i(0); i < num_points; ++i) {
    const AttributeValueIndex att_val_id = attribute.mapped_index(i);
    attribute.GetValue(att_val_id, att_val.get());
    for (int c = 0; c < num_components; ++c) {
      const float value = (att_val[c] - min_values()[c]);
      const int32_t q_val = quantizer.QuantizeFloat(value);
      portable_attribute_data[dst_index++] = q_val;
    }
  }
}